

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSequenceRepeatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  Result *_result;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"SequenceRepeat",(allocator<char> *)&local_60);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_40,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_40);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"SequenceRepeat",&local_61);
        validateRankCount(__return_storage_ptr__,layer,&local_60,5,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSequenceRepeatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SequenceRepeat", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SequenceRepeat", 5, -1, blobNameToRank));
    }

    return Result();
}